

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_swrenderer.cpp
# Opt level: O0

void __thiscall
FSoftwareRenderer::WriteSavePic
          (FSoftwareRenderer *this,player_t *player,FileWriter *file,int width,int height)

{
  int pitch;
  DSimpleCanvas *this_00;
  BYTE *buffer;
  PalEntry *local_458;
  PalEntry local_448 [2];
  PalEntry palette [256];
  DCanvas *pic;
  int height_local;
  int width_local;
  FileWriter *file_local;
  player_t *player_local;
  FSoftwareRenderer *this_local;
  
  this_00 = (DSimpleCanvas *)DObject::operator_new((DObject *)0x50,(size_t)player);
  DSimpleCanvas::DSimpleCanvas(this_00,width,height);
  local_458 = local_448;
  do {
    PalEntry::PalEntry(local_458);
    local_458 = local_458 + 1;
  } while (local_458 != palette + 0xfe);
  (this_00->super_DCanvas).super_DObject.ObjectFlags =
       (this_00->super_DCanvas).super_DObject.ObjectFlags | 8;
  (*(this_00->super_DCanvas).super_DObject._vptr_DObject[8])(this_00,1);
  swrenderer::R_RenderViewToCanvas
            (&player->mo->super_AActor,(DCanvas *)this_00,0,0,width,height,false);
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1b])(screen,local_448)
  ;
  buffer = DCanvas::GetBuffer((DCanvas *)this_00);
  pitch = DCanvas::GetPitch((DCanvas *)this_00);
  M_CreatePNG(file,buffer,local_448,SS_PAL,width,height,pitch);
  (*(this_00->super_DCanvas).super_DObject._vptr_DObject[9])();
  (*(this_00->super_DCanvas).super_DObject._vptr_DObject[4])();
  (this_00->super_DCanvas).super_DObject.ObjectFlags =
       (this_00->super_DCanvas).super_DObject.ObjectFlags | 0x80;
  if (this_00 != (DSimpleCanvas *)0x0) {
    (*(this_00->super_DCanvas).super_DObject._vptr_DObject[2])();
  }
  return;
}

Assistant:

void FSoftwareRenderer::WriteSavePic (player_t *player, FileWriter *file, int width, int height)
{
	DCanvas *pic = new DSimpleCanvas (width, height);
	PalEntry palette[256];

	// Take a snapshot of the player's view
	pic->ObjectFlags |= OF_Fixed;
	pic->Lock ();
	R_RenderViewToCanvas (player->mo, pic, 0, 0, width, height);
	screen->GetFlashedPalette (palette);
	M_CreatePNG (file, pic->GetBuffer(), palette, SS_PAL, width, height, pic->GetPitch());
	pic->Unlock ();
	pic->Destroy();
	pic->ObjectFlags |= OF_YesReallyDelete;
	delete pic;
}